

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotionImposed.cpp
# Opt level: O2

void __thiscall chrono::ChLinkMotionImposed::ChLinkMotionImposed(ChLinkMotionImposed *this)

{
  undefined1 local_48 [24];
  double local_30;
  undefined1 local_28 [16];
  double local_18;
  
  ChLinkMateGeneric::ChLinkMateGeneric(&this->super_ChLinkMateGeneric,true,true,true,true,true,true)
  ;
  (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem
  .super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLinkMotionImposed_0116bfe8;
  (this->position_function).
  super___shared_ptr<chrono::ChFunctionPosition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->position_function).
  super___shared_ptr<chrono::ChFunctionPosition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->rotation_function).
  super___shared_ptr<chrono::ChFunctionRotation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->rotation_function).
  super___shared_ptr<chrono::ChFunctionRotation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48._0_8_ = &DAT_3ff0000000000000;
  local_18 = 0.0;
  local_30 = 0.0;
  local_48._8_16_ = ZEXT416(0) << 0x40;
  local_28 = local_48._8_16_;
  ChFrame<double>::ChFrame
            (&this->frameM2,(ChVector<double> *)local_28,(ChQuaternion<double> *)local_48);
  local_48._0_8_ = &DAT_3ff0000000000000;
  local_18 = 0.0;
  local_30 = 0.0;
  local_28 = ZEXT816(0);
  local_48._8_16_ = ZEXT816(0);
  ChFrame<double>::ChFrame
            (&this->frameMb2,(ChVector<double> *)local_28,(ChQuaternion<double> *)local_48);
  std::make_shared<chrono::ChFunctionPosition_XYZfunctions>();
  std::__shared_ptr<chrono::ChFunctionPosition,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunctionPosition,(__gnu_cxx::_Lock_policy)2> *)
             &this->position_function,
             (__shared_ptr<chrono::ChFunctionPosition_XYZfunctions,_(__gnu_cxx::_Lock_policy)2> *)
             local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::make_shared<chrono::ChFunctionRotation_ABCfunctions>();
  std::__shared_ptr<chrono::ChFunctionRotation,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunctionRotation,(__gnu_cxx::_Lock_policy)2> *)
             &this->rotation_function,
             (__shared_ptr<chrono::ChFunctionRotation_ABCfunctions,_(__gnu_cxx::_Lock_policy)2> *)
             local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  return;
}

Assistant:

ChLinkMotionImposed::ChLinkMotionImposed() : ChLinkMateGeneric(true, true, true, true, true, true) {
    // default motion and rotation: no rotation no translation
	position_function = chrono_types::make_shared<ChFunctionPosition_XYZfunctions>();
	rotation_function = chrono_types::make_shared<ChFunctionRotation_ABCfunctions>();
}